

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

int __thiscall
highs::CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
          (CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__from,char *__to)

{
  int iVar1;
  tuple<double,_int,_long> *ptVar2;
  tuple<double,_int,_long> *in_stack_ffffffffffffff98;
  tuple<double,_int,_long> *__t;
  bool local_51;
  int64_t in_stack_ffffffffffffffd0;
  NodeHybridEstimRbTree *in_stack_ffffffffffffffd8;
  
  if ((char *)*this->first_ == __to) {
    __t = (tuple<double,_int,_long> *)__to;
    ptVar2 = (tuple<double,_int,_long> *)RbTreeLinks<long>::noLink<long,_0>();
    local_51 = true;
    if (__t != ptVar2) {
      HighsNodeQueue::NodeHybridEstimRbTree::getKey
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      HighsNodeQueue::NodeHybridEstimRbTree::getKey
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      local_51 = std::operator<(__t,in_stack_ffffffffffffff98);
    }
    if (local_51 != false) {
      *this->first_ = (LinkType)__from;
    }
  }
  iVar1 = RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
                    (&this->super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>,__from,__to);
  return iVar1;
}

Assistant:

void link(LinkType z, LinkType parent) {
    if (first_ == parent) {
      if (parent == RbTreeLinks<LinkType>::noLink() ||
          static_cast<const Impl*>(this)->getKey(z) <
              static_cast<const Impl*>(this)->getKey(parent))
        first_ = z;
    }

    RbTree<Impl>::link(z, parent);
  }